

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O0

bool slang::syntax::SyntaxFacts::isPossiblePortConnection(TokenKind kind)

{
  bool local_9;
  TokenKind kind_local;
  
  if ((kind == OpenParenthesisStar) || ((ushort)(kind - Comma) < 3)) {
    local_9 = true;
  }
  else {
    local_9 = isPossibleArgument(kind);
  }
  return local_9;
}

Assistant:

bool SyntaxFacts::isPossiblePortConnection(TokenKind kind) {
    switch (kind) {
        case TokenKind::OpenParenthesisStar:
        case TokenKind::DotStar:
        case TokenKind::Dot:
        case TokenKind::Comma:
            return true;
        default:
            return isPossibleArgument(kind);
    }
}